

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::InitializeFromBuf
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string struct_var;
  string local_60;
  string struct_type;
  
  (*(this->namer_).super_Namer._vptr_Namer[7])(&struct_var,&this->namer_,struct_def);
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&struct_type,&this->namer_,struct_def);
  GenIndents_abi_cxx11_(&local_100,this,1);
  std::operator+(&local_e0,&local_100,"@classmethod");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  GenIndents_abi_cxx11_(&local_100,this,1);
  std::operator+(&local_e0,&local_100,"def InitFromBuf(cls, buf, pos):");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  GenIndents_abi_cxx11_(&local_60,this,2);
  std::operator+(&local_a0,&local_60,&struct_var);
  std::operator+(&local_c0,&local_a0," = ");
  std::operator+(&local_100,&local_c0,&struct_type);
  std::operator+(&local_e0,&local_100,"()");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  GenIndents_abi_cxx11_(&local_c0,this,2);
  std::operator+(&local_100,&local_c0,&struct_var);
  std::operator+(&local_e0,&local_100,".Init(buf, pos)");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  GenIndents_abi_cxx11_(&local_a0,this,2);
  std::operator+(&local_c0,&local_a0,"return cls.InitFromObj(");
  std::operator+(&local_100,&local_c0,&struct_var);
  std::operator+(&local_e0,&local_100,")");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::~string((string *)&struct_type);
  std::__cxx11::string::~string((string *)&struct_var);
  return;
}

Assistant:

void InitializeFromBuf(const StructDef &struct_def,
                         std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto struct_var = namer_.Variable(struct_def);
    const auto struct_type = namer_.Type(struct_def);

    code += GenIndents(1) + "@classmethod";
    code += GenIndents(1) + "def InitFromBuf(cls, buf, pos):";
    code += GenIndents(2) + struct_var + " = " + struct_type + "()";
    code += GenIndents(2) + struct_var + ".Init(buf, pos)";
    code += GenIndents(2) + "return cls.InitFromObj(" + struct_var + ")";
    code += "\n";
  }